

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * Tigre::operator+(String *__return_storage_ptr__,string *lhs,string *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  std::__cxx11::string::_M_append((char *)lhs,(ulong)(rhs->_M_dataplus)._M_p);
  local_38._M_dataplus._M_p = (lhs->_M_dataplus)._M_p;
  paVar1 = &lhs->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&lhs->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = lhs->_M_string_length;
  (lhs->_M_dataplus)._M_p = (pointer)paVar1;
  lhs->_M_string_length = 0;
  (lhs->field_2)._M_local_buf[0] = '\0';
  String::String(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Tigre::String Tigre::operator+(std::string lhs, const std::string& rhs){
    lhs += rhs;
    return lhs;
}